

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  long lVar2;
  sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  long lVar3;
  char *file;
  long lVar4;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i;
  iterator it;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  int line;
  Type type;
  string local_548 [8];
  char *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  AssertionResult *in_stack_fffffffffffffad8;
  AssertHelper *in_stack_fffffffffffffae0;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb00;
  AssertionResult local_4c0;
  string local_4b0 [72];
  value_type *in_stack_fffffffffffffb98;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  AssertionResult local_3d0;
  int local_3bc;
  value_type local_30c;
  value_type local_2ac;
  value_type local_24c;
  value_type local_1ec;
  value_type local_18c;
  value_type local_12c;
  value_type local_cc;
  value_type local_6c;
  value_type local_c;
  
  lVar2 = in_RDI + 0x10;
  local_c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                           in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  this_00 = (sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(in_RDI + 0x10);
  local_6c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                            in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  lVar3 = in_RDI + 0x10;
  local_cc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                            in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  file = (char *)(in_RDI + 0x10);
  local_12c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  lVar4 = in_RDI + 0x10;
  local_18c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_1ec = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_24c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_2ac = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_30c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                             in_stack_fffffffffffffa5c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffb00);
  local_3bc = 1;
  while( true ) {
    type = (Type)((ulong)lVar4 >> 0x20);
    line = (int)((ulong)lVar3 >> 0x20);
    if (9 < local_3bc) break;
    in_stack_fffffffffffffa67 = false;
    if (local_3bc != 0) {
      google::
      sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(this_00,(int)((ulong)lVar2 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::end(in_stack_fffffffffffffb00);
      in_stack_fffffffffffffa67 =
           google::
           sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator!=((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                         *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                        (const_iterator *)
                        CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    }
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               (bool *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               (type *)0xafcefe);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 in_stack_fffffffffffffac0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_01,(Type)((ulong)lVar4 >> 0x20),file,(int)((ulong)lVar3 >> 0x20),
                 (char *)this_00);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_4b0);
      testing::Message::~Message((Message *)0xafcfbf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xafd053);
    local_3bc = local_3bc + 1;
  }
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffb00);
  google::
  sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator==((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               (const_iterator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
             (bool *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),(type *)0xafd0c8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               in_stack_fffffffffffffac0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,line,(char *)this_00);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    std::__cxx11::string::~string(local_548);
    testing::Message::~Message((Message *)0xafd180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xafd20b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}